

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O2

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps;
  host_buffer_type vrho;
  host_buffer_type vsigma;
  ulong uVar1;
  ulong uVar2;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  eps = *args_3;
  vrho = *args_4;
  vsigma = *args_5;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPBE_X>(N,rho,sigma,eps,vrho,vsigma);
    return;
  }
  uVar1 = 0;
  uVar2 = (ulong)N;
  if ((int)N < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 8 != uVar1; uVar1 = uVar1 + 8) {
    gga_screening_interface<ExchCXX::BuiltinPBE_X>::eval_exc_vxc_unpolar
              (*(double *)((long)rho + uVar1),*(double *)((long)sigma + uVar1),
               (double *)((long)eps + uVar1),(double *)((long)vrho + uVar1),
               (double *)((long)vsigma + uVar1));
  }
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }